

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O2

void __thiscall duckdb::WindowTokenTreeLocalState::BuildLeaves(WindowTokenTreeLocalState *this)

{
  value_type vVar1;
  ulong uVar2;
  int iVar3;
  type gss;
  reference pvVar4;
  reference pvVar5;
  idx_t entry_idx_p;
  vector<unsigned_char,_true> *this_00;
  SBIterator curr;
  SBIterator prev;
  
  gss = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
        operator*(&(this->token_tree->super_WindowMergeSortTree).global_sort);
  if ((gss->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (gss->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SBIterator::SBIterator(&curr,gss,COMPARE_LESSTHAN,0);
    SBIterator::SBIterator(&prev,gss,COMPARE_LESSTHAN,0);
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&(this->token_tree->super_WindowMergeSortTree).block_starts.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                        (this->super_WindowMergeSortTreeLocalState).build_task);
    vVar1 = *pvVar4;
    pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&(this->token_tree->super_WindowMergeSortTree).block_starts.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                        (this->super_WindowMergeSortTreeLocalState).build_task + 1);
    uVar2 = *pvVar4;
    this_00 = &this->token_tree->deltas;
    if (vVar1 == 0) {
      pvVar5 = vector<unsigned_char,_true>::get<true>(this_00,0);
      *pvVar5 = '\0';
    }
    else {
      entry_idx_p = vVar1 - 1;
      SBIterator::SetIndex(&curr,entry_idx_p);
      SBIterator::SetIndex(&prev,entry_idx_p);
    }
    SBIterator::operator++(&curr);
    while (curr.entry_idx < uVar2) {
      if ((gss->sort_layout).all_constant == true) {
        iVar3 = FastMemcmp(prev.entry_ptr,curr.entry_ptr,(gss->sort_layout).comparison_size);
      }
      else {
        iVar3 = Comparators::CompareTuple
                          (&prev.scan,&curr.scan,&prev.entry_ptr,&curr.entry_ptr,&gss->sort_layout,
                           &prev.external);
      }
      pvVar5 = vector<unsigned_char,_true>::get<true>(this_00,curr.entry_idx);
      *pvVar5 = iVar3 != 0;
      SBIterator::operator++(&curr);
      SBIterator::operator++(&prev);
    }
    SBScanState::~SBScanState(&prev.scan);
    SBScanState::~SBScanState(&curr.scan);
  }
  return;
}

Assistant:

void WindowTokenTreeLocalState::BuildLeaves() {
	auto &global_sort = *token_tree.global_sort;
	if (global_sort.sorted_blocks.empty()) {
		return;
	}

	//	Scan the sort keys and note deltas
	SBIterator curr(global_sort, ExpressionType::COMPARE_LESSTHAN);
	SBIterator prev(global_sort, ExpressionType::COMPARE_LESSTHAN);
	const auto &sort_layout = global_sort.sort_layout;

	const auto block_begin = token_tree.block_starts.at(build_task);
	const auto block_end = token_tree.block_starts.at(build_task + 1);
	auto &deltas = token_tree.deltas;
	if (!block_begin) {
		// First block, so set up initial delta
		deltas[0] = 0;
	} else {
		// Move to the to end of the previous block
		// so we can record the comparison result for the first row
		curr.SetIndex(block_begin - 1);
		prev.SetIndex(block_begin - 1);
	}

	for (++curr; curr.GetIndex() < block_end; ++curr, ++prev) {
		int lt = 0;
		if (sort_layout.all_constant) {
			lt = FastMemcmp(prev.entry_ptr, curr.entry_ptr, sort_layout.comparison_size);
		} else {
			lt = Comparators::CompareTuple(prev.scan, curr.scan, prev.entry_ptr, curr.entry_ptr, sort_layout,
			                               prev.external);
		}

		deltas[curr.GetIndex()] = (lt != 0);
	}
}